

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

vm_obj_id_t CVmObjBigNum::create_radix(int in_root_set,char *str,size_t len,int radix)

{
  int can_have_refs;
  vm_obj_id_t obj_id;
  int in_ECX;
  char *in_RDX;
  CVmObjBigNum *in_RSI;
  vm_obj_id_t id;
  int digits;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  can_have_refs = precision_from_string(str,len,radix);
  obj_id = vm_new_id(in_ECX,can_have_refs,in_stack_ffffffffffffffdc);
  if (in_ECX == 10) {
    CVmObject::operator_new(CONCAT44(10,can_have_refs),obj_id);
    CVmObjBigNum(in_RSI,in_RDX,CONCAT44(in_ECX,can_have_refs),
                 CONCAT44(obj_id,in_stack_ffffffffffffffd8));
  }
  else {
    CVmObject::operator_new(CONCAT44(in_ECX,can_have_refs),obj_id);
    CVmObjBigNum((CVmObjBigNum *)CONCAT44(in_ECX,can_have_refs),
                 CONCAT44(obj_id,in_stack_ffffffffffffffd8));
    vm_objp(0);
    set_str_val(in_RSI,in_RDX,CONCAT44(in_ECX,can_have_refs),obj_id);
  }
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_radix(
    VMG_ int in_root_set, const char *str, size_t len, int radix)
{
    int digits = precision_from_string(str, len, radix);
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    if (radix == 10)
        new (vmg_ id) CVmObjBigNum(vmg_ str, len, digits);
    else
    {
        new (vmg_ id) CVmObjBigNum(vmg_ digits);
        ((CVmObjBigNum *)vm_objp(vmg_ id))->set_str_val(str, len, radix);
    }
    return id;
}